

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::LoadableStateIncrement
          (ChElementTetraCorot_10 *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    plVar1 = *(long **)((long)&(((this->nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar2);
    (**(code **)(*plVar1 + 0xa8))(plVar1,off_x,x_new,x,off_v,Dv);
    off_v = off_v + 3;
    off_x = off_x + 3;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xa0);
  return;
}

Assistant:

void ChElementTetraCorot_10::LoadableStateIncrement(const unsigned int off_x,
                                                    ChState& x_new,
                                                    const ChState& x,
                                                    const unsigned int off_v,
                                                    const ChStateDelta& Dv) {
    for (int i = 0; i < 10; ++i) {
        nodes[i]->NodeIntStateIncrement(off_x + i * 3, x_new, x, off_v + i * 3, Dv);
    }
}